

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

string * __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::filename_abi_cxx11_
          (rotating_file_sink<std::mutex> *this)

{
  filename_t *pfVar1;
  long in_RSI;
  string *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  string *psVar2;
  
  psVar2 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  pfVar1 = details::file_helper::filename_abi_cxx11_((file_helper *)(in_RSI + 0x78));
  std::__cxx11::string::string(in_RDI,(string *)pfVar1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x295bda);
  return psVar2;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::filename() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    return file_helper_.filename();
}